

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
           *this,ArenaAllocator *allocator,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **element)

{
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPVar1;
  code *pcVar2;
  bool bVar3;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *pSVar4;
  undefined4 *puVar5;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **buffer;
  
  buffer = element + -2;
  pSVar4 = (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)this;
  do {
    pSVar4 = (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
             (((DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                *)pSVar4)->
             super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
             ).next.node;
    if (pSVar4 == (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                  this) break;
  } while (pSVar4 != (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                     )buffer);
  if (pSVar4 == (ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)this
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pPVar1 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)*buffer;
  element[-1]->cache = pPVar1;
  (pPVar1->types).super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.buffer.ptr =
       (WriteBarrierPtr<Js::Type> *)element[-1];
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x18);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }